

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_syms.c
# Opt level: O2

_Bool gen_iosym(int K,int T,int n_ESIs,uint32_t *ESIs)

{
  uint uVar1;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  size_t sVar2;
  void *__ptr_02;
  undefined8 uVar3;
  undefined4 in_register_0000003c;
  char *pcVar4;
  _Bool _Var5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  undefined8 uStack_60;
  size_t prog_sz;
  size_t inter_sym_num;
  size_t work_sz;
  
  uVar1 = RqInterGetMemSizes(CONCAT44(in_register_0000003c,K),0,0,0,&inter_sym_num);
  if (uVar1 == 0) {
    uVar1 = RqOutGetMemSizes(n_ESIs,&work_sz,&prog_sz);
    if (uVar1 == 0) {
      __ptr = malloc(work_sz);
      __ptr_00 = malloc(prog_sz);
      uVar1 = RqOutInit(K,__ptr,work_sz);
      if (uVar1 == 0) {
        uVar6 = 0;
        uVar8 = 0;
        if (0 < n_ESIs) {
          uVar8 = (ulong)(uint)n_ESIs;
        }
        do {
          if (uVar8 == uVar6) {
            uVar1 = RqOutCompile(__ptr,__ptr_00,prog_sz);
            if (uVar1 != 0) {
              __ptr_02 = (void *)0x0;
              fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                      ,0x85,"RqOutCompile(wrk, prog, prog_sz)",(ulong)uVar1);
              __ptr_01 = (void *)0x0;
              goto LAB_0010180e;
            }
            sVar7 = inter_sym_num * (long)T;
            __ptr_01 = malloc(sVar7);
            sVar2 = fread(__ptr_01,1,sVar7,_stdin);
            if (sVar2 != sVar7) {
              fwrite("Error:  fread() returned a short count.\n",0x28,1,_stderr);
              goto LAB_00101832;
            }
            sVar2 = (size_t)(n_ESIs * T);
            __ptr_02 = malloc(sVar2);
            uVar1 = RqOutExecute(__ptr_00,(long)T,__ptr_01,__ptr_02,sVar2);
            if (uVar1 != 0) {
              _Var5 = false;
              fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
                      ,0x93,"RqOutExecute(prog, T, indata, outdata, outdata_sz)",(ulong)uVar1);
              goto LAB_0010186c;
            }
            sVar7 = fwrite(__ptr_02,1,sVar2,_stdout);
            _Var5 = true;
            if (sVar7 == sVar2) goto LAB_0010186c;
            fwrite("Error:  fwrite() returned a short count.\n",0x29,1,_stderr);
            goto LAB_0010180e;
          }
          uVar1 = RqOutAddIds(__ptr,ESIs[uVar6],1);
          uVar6 = uVar6 + 1;
        } while (uVar1 == 0);
        pcVar4 = "RqOutAddIds(wrk, ESIs[i], 1)";
        uVar3 = 0x84;
      }
      else {
        pcVar4 = "RqOutInit(K, wrk, work_sz)";
        uVar3 = 0x82;
      }
      fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
              ,uVar3,pcVar4,(ulong)uVar1);
      __ptr_01 = (void *)0x0;
LAB_00101832:
      __ptr_02 = (void *)0x0;
      _Var5 = false;
      goto LAB_0010186c;
    }
    pcVar4 = "RqOutGetMemSizes(n_ESIs, &work_sz, &prog_sz)";
    uStack_60 = 0x7e;
  }
  else {
    pcVar4 = "RqInterGetMemSizes(K, 0, ((void*)0), ((void*)0), &inter_sym_num)";
    uStack_60 = 0x7b;
  }
  __ptr_02 = (void *)0x0;
  fprintf(_stderr,"Error:%s:%d: %s returned %d.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lorinder[P]TvRQ/samples_tests/api/gen_syms.c"
          ,uStack_60,pcVar4,(ulong)uVar1);
  __ptr_01 = (void *)0x0;
  __ptr_00 = (void *)0x0;
  __ptr = (void *)0x0;
LAB_0010180e:
  _Var5 = false;
LAB_0010186c:
  free(__ptr_02);
  free(__ptr_01);
  free(__ptr_00);
  free(__ptr);
  return _Var5;
}

Assistant:

bool gen_iosym(int K, int T, int n_ESIs, uint32_t* ESIs)
{
	bool success = false;

	RqOutWorkMem* wrk = NULL;
	RqOutProgram* prog = NULL;
	void* indata = NULL;
	void* outdata = NULL;

	size_t work_sz, prog_sz, inter_sym_num;
	RUN_NOFAIL(RqInterGetMemSizes(K, 0, NULL, NULL, &inter_sym_num), xit);
	RUN_NOFAIL(RqOutGetMemSizes(n_ESIs,
				&work_sz,
				&prog_sz), xit);
	wrk = malloc(work_sz);
	prog = malloc(prog_sz);

	RUN_NOFAIL(RqOutInit(K, wrk, work_sz), xit);
	for (int i = 0; i < n_ESIs; ++i)
		RUN_NOFAIL(RqOutAddIds(wrk, ESIs[i], 1), xit);
	RUN_NOFAIL(RqOutCompile(wrk, prog, prog_sz), xit);

	/* Read source data */
	size_t indata_sz = T * (size_t)inter_sym_num;
	indata = malloc(indata_sz);
	size_t ret = fread(indata, 1, indata_sz, stdin);
	if (ret != indata_sz) {
		fprintf(stderr, "Error:  fread() returned a short count.\n");
		goto xit;
	}

	/* Generate iblock data */
	size_t outdata_sz = T * n_ESIs;
	outdata = malloc(outdata_sz);
	RUN_NOFAIL(RqOutExecute(prog, T, indata, outdata, outdata_sz), xit);

	/* Print them to stdout */
	size_t out_written = fwrite(outdata, 1, outdata_sz, stdout);
	if (out_written != outdata_sz) {
		fprintf(stderr, "Error:  fwrite() returned a short count.\n");
		goto xit;
	}

	success = true;
xit:
	if (outdata)		free(outdata);
	if (indata)		free(indata);
	if (prog)		free(prog);
	if (wrk)		free(wrk);
	return success;
}